

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::Appender::Appender(Appender *this,Connection *con,string *schema_name,string *table_name)

{
  allocator local_49;
  string local_48;
  
  ::std::__cxx11::string::string((string *)&local_48,anon_var_dwarf_4b0ffdd + 9,&local_49);
  Appender(this,con,&local_48,schema_name,table_name);
  ::std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

Appender::Appender(Connection &con, const string &schema_name, const string &table_name)
    : Appender(con, INVALID_CATALOG, schema_name, table_name) {
}